

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

bool DivisionCornerCaseHelper<short,_unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter,_1>
     ::DivisionCornerCase1
               (uint lhs,SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs,
               SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *result)

{
  bool bVar1;
  short sVar2;
  undefined2 *in_RDX;
  undefined2 in_SI;
  uint in_EDI;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined2 in_stack_ffffffffffffffe4;
  undefined2 in_stack_ffffffffffffffe6;
  undefined4 in_stack_ffffffffffffffe8;
  undefined2 in_stack_ffffffffffffffec;
  undefined2 in_stack_ffffffffffffffee;
  
  sVar2 = ::SafeInt::operator_cast_to_short
                    ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                     CONCAT26(in_stack_ffffffffffffffe6,
                              CONCAT24(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0)));
  if (sVar2 < 1) {
    sVar2 = ::SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT26(in_stack_ffffffffffffffe6,
                                CONCAT24(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0)));
    if (sVar2 == 0) {
      safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnDivZero();
    }
    bVar1 = DivisionNegativeCornerCaseHelper<short,_unsigned_int,_safeint_exception_handlers::SafeInt_InvalidParameter,_1>
            ::NegativeCornerCase
                      ((uint)in_RDX,
                       (SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>)
                       (short)((ulong)in_RDX >> 0x20),
                       (SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT26(in_stack_ffffffffffffffee,
                                CONCAT24(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8)));
    if (!bVar1) {
      sVar2 = ::SafeInt::operator_cast_to_short
                        ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                         CONCAT26(in_SI,CONCAT24(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0
                                                )));
      SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<unsigned_int>
                ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                 CONCAT26(in_SI,CONCAT24(in_stack_ffffffffffffffe4,in_EDI / (uint)(int)sVar2)),
                 (uint *)CONCAT44(in_stack_ffffffffffffffdc,in_EDI));
      *in_RDX = in_stack_ffffffffffffffe4;
    }
  }
  else {
    ::SafeInt::operator_cast_to_short
              ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
               CONCAT26(in_stack_ffffffffffffffe6,
                        CONCAT24(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0)));
    SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<unsigned_int>
              ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
               CONCAT26(in_stack_ffffffffffffffe6,
                        CONCAT24(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0)),
               (uint *)CONCAT44(in_EDI,in_stack_ffffffffffffffd8));
    *in_RDX = in_stack_ffffffffffffffee;
  }
  return true;
}

Assistant:

static bool DivisionCornerCase1( U lhs, SafeInt< T, E > rhs, SafeInt<T, E>& result ) SAFEINT_CPP_THROW
    {
        if( (T)rhs > 0 )
        {
            result = SafeInt< T, E >( lhs/(T)rhs );
            return true;
        }

        // Now rhs is either negative, or zero
        if( (T)rhs != 0 )
        {
            if( DivisionNegativeCornerCaseHelper< T, U, E, sizeof( U ) >= 4 && sizeof( T ) <= sizeof( U ) >::NegativeCornerCase( lhs, rhs, result ) )
                return true;

            result = SafeInt< T, E >(lhs/(T)rhs);
            return true;
        }

        E::SafeIntOnDivZero();
    }